

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O2

void helper_mtc0_tchalt_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  int iVar1;
  CPUMIPSState_conflict5 *__mptr;
  ulong uVar2;
  MIPSCPU_conflict2 *cpu;
  
  cpu = (MIPSCPU_conflict2 *)(env[-3].tcs[0xc].gpr + 0x12);
  uVar2 = arg1 & 1;
  (env->active_tc).CP0_TCHalt = uVar2;
  if (uVar2 != 0) {
    mips_tc_sleep(cpu,(int)uVar2);
    return;
  }
  iVar1 = mips_vpe_active(env);
  if (iVar1 == 0) {
    return;
  }
  if (((int)env[-1].tcs[0xd].PC != 0) && (iVar1 = mips_vpe_active(env), iVar1 != 0)) {
    return;
  }
  (*cpu_interrupt_handler)((CPUState *)cpu,0x100);
  return;
}

Assistant:

void helper_mtc0_tchalt(CPUMIPSState *env, target_ulong arg1)
{
    MIPSCPU *cpu = env_archcpu(env);

    env->active_tc.CP0_TCHalt = arg1 & 0x1;

    /* TODO: Halt TC / Restart (if allocated+active) TC. */
    if (env->active_tc.CP0_TCHalt & 1) {
        mips_tc_sleep(cpu, env->current_tc);
    } else {
        mips_tc_wake(cpu, env->current_tc);
    }
}